

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68020_cpdbcc(m68k_info *info)

{
  uint *puVar1;
  byte bVar2;
  uint uVar3;
  MCInst *inst;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  
  if ((info->type & 0x1c) != 0) {
    uVar3 = info->pc;
    iVar6 = (int)info->baseAddress;
    uVar5 = (ulong)(info->address_mask & uVar3 - iVar6);
    uVar4 = 0x2a;
    if (uVar5 + 2 <= info->code_len) {
      uVar4 = info->code[uVar5 + 1] & 0x2f;
    }
    info->pc = uVar3 + 2;
    uVar5 = (ulong)(info->address_mask & (uVar3 + 2) - iVar6);
    uVar7 = 0xaaaa;
    if (uVar5 + 2 <= info->code_len) {
      uVar7 = (uint)(ushort)(*(ushort *)(info->code + uVar5) << 8 |
                            *(ushort *)(info->code + uVar5) >> 8);
    }
    info->pc = uVar3 + 4;
    inst = info->inst;
    puVar1 = &inst->Opcode;
    *puVar1 = *puVar1 + uVar4;
    MCInst_setOpcode(inst,0x82);
    (info->extension).op_count = '\x02';
    (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
    (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
    (info->extension).operands[0].field_0.reg = (info->ir & 7) + M68K_REG_D0;
    (info->extension).operands[1].type = M68K_OP_BR_DISP;
    (info->extension).operands[1].address_mode = M68K_AM_BRANCH_DISPLACEMENT;
    (info->extension).operands[1].br_disp.disp = ((int)(short)uVar7 & 0xffff0000U) + uVar7 + 2;
    (info->extension).operands[1].br_disp.disp_size = '\x02';
    bVar2 = info->groups_count;
    info->groups_count = bVar2 + 1;
    info->groups[bVar2] = '\x01';
    bVar2 = info->groups_count;
    info->groups_count = bVar2 + 1;
    info->groups[bVar2] = '\a';
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68020_cpdbcc(m68k_info *info)
{
	cs_m68k* ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	uint ext1, ext2;

	LIMIT_CPU_TYPES(info, M68020_PLUS);

	ext1 = read_imm_16(info);
	ext2 = read_imm_16(info);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (ext1 & 0x2f);

	ext = build_init_op(info, M68K_INS_FDBF, 2, 0);
	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	op0->reg = M68K_REG_D0 + (info->ir & 7);

	make_cpbcc_operand(op1, M68K_OP_BR_DISP_SIZE_WORD, make_int_16(ext2) + 2);

	set_insn_group(info, M68K_GRP_JUMP);
	set_insn_group(info, M68K_GRP_BRANCH_RELATIVE);
}